

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O2

void CreateInstallGenerator
               (cmMakefile *makefile,string *dest,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  string *psVar1;
  undefined1 local_f3 [2];
  bool no_exclude_from_all;
  undefined1 local_f0 [20];
  MessageLevel message;
  undefined1 local_d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_configurations;
  string destination;
  string no_rename;
  string no_permissions;
  string no_component;
  
  std::__cxx11::string::substr((ulong)&destination,(ulong)dest);
  cmsys::SystemTools::ConvertToUnixSlashes(&destination);
  if (destination._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&destination);
  }
  no_permissions._M_dataplus._M_p = (pointer)&no_permissions.field_2;
  no_permissions._M_string_length = 0;
  no_rename._M_dataplus._M_p = (pointer)&no_rename.field_2;
  no_rename._M_string_length = 0;
  no_permissions.field_2._M_local_buf[0] = '\0';
  no_rename.field_2._M_local_buf[0] = '\0';
  no_exclude_from_all = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&no_configurations,"CMAKE_INSTALL_DEFAULT_COMPONENT_NAME",
             (allocator<char> *)local_d8);
  psVar1 = cmMakefile::GetSafeDefinition(makefile,(string *)&no_configurations);
  std::__cxx11::string::string((string *)&no_component,(string *)psVar1);
  std::__cxx11::string::~string((string *)&no_configurations);
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  message = cmInstallGenerator::SelectMessageLevel(makefile,false);
  local_f3[1] = 0;
  local_f3[0] = 0;
  cmMakefile::GetBacktrace((cmMakefile *)local_d8);
  std::
  make_unique<cmInstallFilesGenerator,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,bool,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,cmInstallGenerator::MessageLevel&,bool&,std::__cxx11::string_const&,bool,cmListFileBacktrace>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)files,
             (bool *)&destination,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_f3 + 1),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&no_permissions,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&no_configurations
             ,(MessageLevel *)&no_component,(bool *)&message,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &no_exclude_from_all,(bool *)&no_rename,(cmListFileBacktrace *)local_f3);
  local_f0._8_8_ = local_f0._0_8_;
  local_f0._0_8_ = (pointer)0x0;
  cmMakefile::AddInstallGenerator
            (makefile,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                      (local_f0 + 8));
  if ((pointer)local_f0._8_8_ != (pointer)0x0) {
    (**(code **)(((_Alloc_hider *)local_f0._8_8_)->_M_p + 8))();
  }
  local_f0._8_8_ = (pointer)0x0;
  if ((pointer)local_f0._0_8_ != (pointer)0x0) {
    (**(code **)(((_Alloc_hider *)local_f0._0_8_)->_M_p + 8))();
  }
  local_f0._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_configurations);
  std::__cxx11::string::~string((string *)&no_component);
  std::__cxx11::string::~string((string *)&no_rename);
  std::__cxx11::string::~string((string *)&no_permissions);
  std::__cxx11::string::~string((string *)&destination);
  return;
}

Assistant:

static void CreateInstallGenerator(cmMakefile& makefile,
                                   std::string const& dest,
                                   std::vector<std::string> const& files)
{
  // Construct the destination.  This command always installs under
  // the prefix.  We skip the leading slash given by the user.
  std::string destination = dest.substr(1);
  cmSystemTools::ConvertToUnixSlashes(destination);
  if (destination.empty()) {
    destination = ".";
  }

  // Use a file install generator.
  const std::string no_permissions;
  const std::string no_rename;
  bool no_exclude_from_all = false;
  std::string no_component =
    makefile.GetSafeDefinition("CMAKE_INSTALL_DEFAULT_COMPONENT_NAME");
  std::vector<std::string> no_configurations;
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(&makefile);
  makefile.AddInstallGenerator(cm::make_unique<cmInstallFilesGenerator>(
    files, destination, false, no_permissions, no_configurations, no_component,
    message, no_exclude_from_all, no_rename, false, makefile.GetBacktrace()));
}